

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::NewFloatConstantValue(GlobOpt *this,FloatConstType floatValue,Opnd *opnd)

{
  FloatConstantValueInfo *valueInfo;
  Value *val;
  
  valueInfo = FloatConstantValueInfo::New(this->alloc,floatValue);
  val = NewValue(this,&valueInfo->super_ValueInfo);
  GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,val,opnd);
  return val;
}

Assistant:

Value *
GlobOpt::NewFloatConstantValue(const FloatConstType floatValue, IR::Opnd *const opnd)
{
    FloatConstantValueInfo *valueInfo = FloatConstantValueInfo::New(this->alloc, floatValue);
    Value *val = NewValue(valueInfo);

    CurrentBlockData()->InsertNewValue(val, opnd);
    return val;
}